

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

bool __thiscall cmArchiveWrite::AddData(cmArchiveWrite *this,char *file,size_t size)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  long lVar3;
  size_t sVar4;
  size_t local_4340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4320;
  string local_4300;
  string local_42e0;
  string local_42c0;
  size_t local_42a0;
  ssize_type nnext_s;
  size_t nnext;
  size_t nleft;
  char buffer [16384];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  long local_230;
  ifstream fin;
  size_t size_local;
  char *file_local;
  cmArchiveWrite *this_local;
  
  size_local = (size_t)file;
  file_local = (char *)this;
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&local_230,file,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
  sVar4 = size;
  if ((bVar1 & 1) == 0) {
    while (nnext = sVar4, nnext != 0) {
      if (nnext < 0x4001) {
        local_4340 = nnext;
      }
      else {
        local_4340 = 0x4000;
      }
      nnext_s = local_4340;
      local_42a0 = local_4340;
      std::istream::read((char *)&local_230,(long)&nleft);
      lVar3 = std::istream::gcount();
      if (lVar3 != nnext_s) break;
      sVar4 = archive_write_data(this->Archive,&nleft,nnext_s);
      if (sVar4 != local_42a0) {
        cm_archive_error_string_abi_cxx11_(&local_42e0,this->Archive);
        cmStrCat<char_const(&)[21],std::__cxx11::string>
                  (&local_42c0,(char (*) [21])"archive_write_data: ",&local_42e0);
        std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_42c0);
        std::__cxx11::string::~string((string *)&local_42c0);
        std::__cxx11::string::~string((string *)&local_42e0);
        this_local._7_1_ = 0;
        goto LAB_0066b7c7;
      }
      sVar4 = nnext - nnext_s;
    }
    if (nnext == 0) {
      this_local._7_1_ = 1;
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      cmStrCat<char_const(&)[16],char_const*&,char_const(&)[4],std::__cxx11::string>
                (&local_4300,(char (*) [16])"Error reading \"",(char **)&size_local,
                 (char (*) [4])0x1001dbf,&local_4320);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_4300);
      std::__cxx11::string::~string((string *)&local_4300);
      std::__cxx11::string::~string((string *)&local_4320);
      this_local._7_1_ = 0;
    }
  }
  else {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    cmStrCat<char_const(&)[16],char_const*&,char_const(&)[4],std::__cxx11::string>
              (&local_260,(char (*) [16])"Error opening \"",(char **)&size_local,
               (char (*) [4])0x1001dbf,&local_280);
    std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    this_local._7_1_ = 0;
  }
LAB_0066b7c7:
  buffer[0x3ffc] = '\x01';
  buffer[0x3ffd] = '\0';
  buffer[0x3ffe] = '\0';
  buffer[0x3fff] = '\0';
  std::ifstream::~ifstream(&local_230);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmArchiveWrite::AddData(const char* file, size_t size)
{
  cmsys::ifstream fin(file, std::ios::in | std::ios::binary);
  if (!fin) {
    this->Error = cmStrCat("Error opening \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }

  char buffer[16384];
  size_t nleft = size;
  while (nleft > 0) {
    using ssize_type = std::streamsize;
    size_t const nnext = nleft > sizeof(buffer) ? sizeof(buffer) : nleft;
    ssize_type const nnext_s = static_cast<ssize_type>(nnext);
    fin.read(buffer, nnext_s);
    // Some stream libraries (older HPUX) return failure at end of
    // file on the last read even if some data were read.  Check
    // gcount instead of trusting the stream error status.
    if (static_cast<size_t>(fin.gcount()) != nnext) {
      break;
    }
    if (archive_write_data(this->Archive, buffer, nnext) != nnext_s) {
      this->Error = cmStrCat("archive_write_data: ",
                             cm_archive_error_string(this->Archive));
      return false;
    }
    nleft -= nnext;
  }
  if (nleft > 0) {
    this->Error = cmStrCat("Error reading \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }
  return true;
}